

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O2

void __thiscall
aeron::archive::ChannelUri::ChannelUri(ChannelUri *this,string *media,ParamsMap *params)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  ChannelUri(this,&local_40,media,params);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

ChannelUri::ChannelUri(const std::string& media, ParamsMap&& params)
    : ChannelUri("", media, std::move(params)) {}